

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O1

int If_CutComputeTruth(If_Man_t *p,If_Cut_t *pCut,If_Cut_t *pCut0,If_Cut_t *pCut1,int fCompl0,
                      int fCompl1)

{
  byte bVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  Vec_Mem_t *pVVar4;
  word *pwVar5;
  word *pTruth;
  word *pTruth_00;
  word *pTruth_01;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  undefined1 *puVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  word *pwVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  Vec_Int_t *p_00;
  
  uVar21 = pCut0->iCutFunc;
  if ((int)uVar21 < 0) {
LAB_004370bc:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar19 = *(uint *)&pCut0->field_0x1c >> 0x18;
  pVVar3 = p->vTtMem[uVar19];
  uVar12 = uVar21 >> 1;
  if (pVVar3->nEntries <= (int)uVar12) {
LAB_004370db:
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  uVar2 = pCut1->iCutFunc;
  if ((int)uVar2 < 0) goto LAB_004370bc;
  pVVar4 = p->vTtMem[(byte)pCut1->field_0x1f];
  uVar14 = uVar2 >> 1;
  if (pVVar4->nEntries <= (int)uVar14) goto LAB_004370db;
  iVar13 = (uVar12 & pVVar3->PageMask) * pVVar3->nEntrySize;
  pwVar17 = pVVar3->ppPages[uVar12 >> ((byte)pVVar3->LogPageSze & 0x1f)];
  iVar15 = (uVar14 & pVVar4->PageMask) * pVVar4->nEntrySize;
  pwVar5 = pVVar4->ppPages[uVar14 >> ((byte)pVVar4->LogPageSze & 0x1f)];
  pTruth = (word *)p->puTemp[0];
  pTruth_00 = (word *)p->puTemp[1];
  pTruth_01 = (word *)p->puTemp[2];
  uVar12 = p->nTruth6Words[uVar19];
  if ((*(uint *)&pCut0->field_0x1c >> 0xc & 1 ^ fCompl0) == (uVar21 & 1)) {
    if (0 < (int)uVar12) {
      uVar18 = 0;
      do {
        pTruth[uVar18] = pwVar17[(long)iVar13 + uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar12 != uVar18);
    }
  }
  else if (0 < (int)uVar12) {
    uVar18 = 0;
    do {
      pTruth[uVar18] = ~pwVar17[(long)iVar13 + uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar12 != uVar18);
  }
  uVar21 = p->nTruth6Words[*(uint *)&pCut1->field_0x1c >> 0x18];
  if ((*(uint *)&pCut1->field_0x1c >> 0xc & 1 ^ fCompl1) == (uVar2 & 1)) {
    if (0 < (int)uVar21) {
      uVar18 = 0;
      do {
        pTruth_00[uVar18] = pwVar5[(long)iVar15 + uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar21 != uVar18);
    }
  }
  else if (0 < (int)uVar21) {
    uVar18 = 0;
    do {
      pTruth_00[uVar18] = ~pwVar5[(long)iVar15 + uVar18];
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  uVar21 = *(uint *)&pCut0->field_0x1c;
  uVar12 = *(uint *)&pCut->field_0x1c;
  if (uVar21 >> 0x18 != uVar12 >> 0x18) {
    if (uVar12 >> 0x18 <= uVar21 >> 0x18) goto LAB_00437119;
    uVar19 = 1 << ((char)(uVar21 >> 0x18) - 6U & 0x1f);
    if (uVar21 < 0x7000000) {
      uVar19 = 1;
    }
    uVar21 = 1 << ((char)(uVar12 >> 0x18) - 6U & 0x1f);
    if (uVar12 < 0x7000000) {
      uVar21 = 1;
    }
    if (uVar19 != uVar21) {
      if ((int)uVar21 <= (int)uVar19) goto LAB_00437176;
      if (0 < (int)uVar21) {
        lVar16 = 0;
        pwVar17 = pTruth;
        do {
          if (0 < (int)uVar19) {
            uVar18 = 0;
            do {
              pwVar17[uVar18] = pTruth[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar19 != uVar18);
          }
          lVar16 = lVar16 + (int)uVar19;
          pwVar17 = pwVar17 + (int)uVar19;
        } while (lVar16 < (long)(ulong)uVar21);
      }
    }
  }
  uVar21 = *(uint *)&pCut1->field_0x1c;
  uVar12 = *(uint *)&pCut->field_0x1c;
  if (uVar21 >> 0x18 != uVar12 >> 0x18) {
    if (uVar12 >> 0x18 <= uVar21 >> 0x18) {
LAB_00437119:
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar19 = 1 << ((char)(uVar21 >> 0x18) - 6U & 0x1f);
    if (uVar21 < 0x7000000) {
      uVar19 = 1;
    }
    uVar21 = 1 << ((char)(uVar12 >> 0x18) - 6U & 0x1f);
    if (uVar12 < 0x7000000) {
      uVar21 = 1;
    }
    if (uVar19 != uVar21) {
      if ((int)uVar21 <= (int)uVar19) {
LAB_00437176:
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar21) {
        lVar16 = 0;
        pwVar17 = pTruth_00;
        do {
          if (0 < (int)uVar19) {
            uVar18 = 0;
            do {
              pwVar17[uVar18] = pTruth_00[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar19 != uVar18);
          }
          lVar16 = lVar16 + (int)uVar19;
          pwVar17 = pwVar17 + (int)uVar19;
        } while (lVar16 < (long)(ulong)uVar21);
      }
    }
  }
  uVar21 = (*(uint *)&pCut0->field_0x1c >> 0x18) - 1;
  if (0xffffff < *(uint *)&pCut0->field_0x1c && 0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar12 = *(uint *)&pCut->field_0x1c >> 0x18;
    uVar18 = (ulong)uVar12;
    do {
      uVar20 = uVar18 - 1;
      if ((int)*(float *)(&pCut->field_0x1c + uVar18 * 4) <= (int)(&pCut0[1].Area)[uVar21]) {
        if (*(float *)(&pCut->field_0x1c + uVar18 * 4) != (&pCut0[1].Area)[uVar21])
        goto LAB_0043709d;
        if ((long)(int)uVar21 < (long)uVar20) {
          Abc_TtSwapVars(pTruth,uVar12,uVar21,(int)uVar20);
        }
        uVar21 = uVar21 - 1;
      }
    } while ((1 < (long)uVar18) && (uVar18 = uVar20, -1 < (int)uVar21));
  }
  if (uVar21 == 0xffffffff) {
    uVar21 = (*(uint *)&pCut1->field_0x1c >> 0x18) - 1;
    if (0xffffff < *(uint *)&pCut1->field_0x1c && 0xffffff < *(uint *)&pCut->field_0x1c) {
      uVar12 = *(uint *)&pCut->field_0x1c >> 0x18;
      uVar18 = (ulong)uVar12;
      do {
        uVar20 = uVar18 - 1;
        if ((int)*(float *)(&pCut->field_0x1c + uVar18 * 4) <= (int)(&pCut1[1].Area)[uVar21]) {
          if (*(float *)(&pCut->field_0x1c + uVar18 * 4) != (&pCut1[1].Area)[uVar21]) {
LAB_0043709d:
            __assert_fail("pCut[i] == pCut0[k]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
          }
          if ((long)(int)uVar21 < (long)uVar20) {
            Abc_TtSwapVars(pTruth_00,uVar12,uVar21,(int)uVar20);
          }
          uVar21 = uVar21 - 1;
        }
      } while ((1 < (long)uVar18) && (uVar18 = uVar20, -1 < (int)uVar21));
    }
    if (uVar21 == 0xffffffff) {
      uVar21 = p->nTruth6Words[(byte)pCut->field_0x1f];
      uVar12 = (uint)*pTruth_00 & (uint)*pTruth & 1;
      if (uVar12 == 0) {
        if (0 < (int)uVar21) {
          uVar18 = 0;
          do {
            pTruth_01[uVar18] = pTruth_00[uVar18] & pTruth[uVar18];
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
        }
      }
      else if (0 < (int)uVar21) {
        uVar18 = 0;
        do {
          pTruth_01[uVar18] = ~(pTruth_00[uVar18] & pTruth[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar21 != uVar18);
      }
      iVar13 = 0;
      if (p->pPars->fCutMin != 0) {
        bVar1 = pCut->field_0x1f;
        iVar13 = 0;
        if (((*(uint *)&pCut1->field_0x1c < 0x1000000) || (*(uint *)&pCut0->field_0x1c < 0x1000000))
           || ((uint)bVar1 <
               (*(uint *)&pCut1->field_0x1c >> 0x18) + (*(uint *)&pCut0->field_0x1c >> 0x18))) {
          uVar21 = Abc_TtMinBase(pTruth_01,(int *)(pCut + 1),(uint)bVar1,(uint)bVar1);
          if ((int)uVar21 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffff | uVar21 << 0x18;
            if ((uVar21 & 0xff) == 0) {
              uVar19 = 0;
            }
            else {
              uVar18 = 0;
              uVar19 = 0;
              do {
                uVar19 = uVar19 | 1 << (uint)(&pCut[1].Area)[uVar18] % 0x1f;
                uVar18 = uVar18 + 1;
              } while ((uVar21 & 0xff) != uVar18);
            }
            pCut->uSign = uVar19;
            iVar13 = 1;
          }
        }
      }
      iVar15 = p->vTtMem[(byte)pCut->field_0x1f]->nEntries;
      iVar9 = Vec_MemHashInsert(p->vTtMem[(byte)pCut->field_0x1f],pTruth_01);
      if (iVar9 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pCut->iCutFunc = uVar12 + iVar9 * 2;
      if ((*pTruth_01 & 1) != 0) {
        __assert_fail("(pTruth[0] & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                      ,0x7f,
                      "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                     );
      }
      pVVar6 = p->vTtIsops[(byte)pCut->field_0x1f];
      if (pVVar6 == (Vec_Wec_t *)0x0) {
        return iVar13;
      }
      if (iVar15 == p->vTtMem[(byte)pCut->field_0x1f]->nEntries) {
        return iVar13;
      }
      uVar21 = pVVar6->nCap;
      if (pVVar6->nSize == uVar21) {
        if ((int)uVar21 < 0x10) {
          if (pVVar6->pArray == (Vec_Int_t *)0x0) {
            pVVar10 = (Vec_Int_t *)malloc(0x100);
          }
          else {
            pVVar10 = (Vec_Int_t *)realloc(pVVar6->pArray,0x100);
          }
          pVVar6->pArray = pVVar10;
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar21 * 2;
          if (iVar15 <= (int)uVar21) goto LAB_00436f8e;
          if (pVVar6->pArray == (Vec_Int_t *)0x0) {
            pVVar10 = (Vec_Int_t *)malloc((ulong)uVar21 << 5);
          }
          else {
            pVVar10 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar21 << 5);
          }
          pVVar6->pArray = pVVar10;
        }
        memset(pVVar10 + pVVar6->nCap,0,((long)iVar15 - (long)pVVar6->nCap) * 0x10);
        pVVar6->nCap = iVar15;
      }
LAB_00436f8e:
      iVar15 = pVVar6->nSize;
      uVar21 = iVar15 + 1;
      pVVar6->nSize = uVar21;
      if (iVar15 < 0) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
      }
      pVVar10 = pVVar6->pArray;
      iVar15 = Kit_TruthIsop((uint *)pTruth_01,(uint)(byte)pCut->field_0x1f,p->vCover,1);
      if (-1 < iVar15) {
        p_00 = pVVar10 + ((ulong)uVar21 - 1);
        iVar9 = p->vCover->nSize;
        if (p_00->nCap < iVar9) {
          if (pVVar10[(ulong)uVar21 - 1].pArray == (int *)0x0) {
            piVar11 = (int *)malloc((long)iVar9 << 2);
          }
          else {
            piVar11 = (int *)realloc(pVVar10[(ulong)uVar21 - 1].pArray,(long)iVar9 << 2);
          }
          pVVar10[(ulong)uVar21 - 1].pArray = piVar11;
          if (piVar11 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          p_00->nCap = iVar9;
        }
        pVVar7 = p->vCover;
        if (0 < pVVar7->nSize) {
          lVar16 = 0;
          do {
            Vec_IntPush(p_00,pVVar7->pArray[lVar16]);
            lVar16 = lVar16 + 1;
          } while (lVar16 < pVVar7->nSize);
        }
        if (iVar15 != 0) {
          puVar8 = (undefined1 *)((long)&pVVar10[(ulong)uVar21 - 1].nCap + 2);
          *puVar8 = *puVar8 ^ 1;
        }
      }
      if (p->vTtIsops[(byte)pCut->field_0x1f]->nSize == p->vTtMem[(byte)pCut->field_0x1f]->nEntries)
      {
        return iVar13;
      }
      __assert_fail("Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x93,
                    "int If_CutComputeTruth(If_Man_t *, If_Cut_t *, If_Cut_t *, If_Cut_t *, int, int)"
                   );
    }
  }
  __assert_fail("k == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
}

Assistant:

int If_CutComputeTruth( If_Man_t * p, If_Cut_t * pCut, If_Cut_t * pCut0, If_Cut_t * pCut1, int fCompl0, int fCompl1 )
{
    int fCompl, truthId, nLeavesNew, PrevSize, RetValue = 0;
    word * pTruth0s = Vec_MemReadEntry( p->vTtMem[pCut0->nLeaves], Abc_Lit2Var(pCut0->iCutFunc) );
    word * pTruth1s = Vec_MemReadEntry( p->vTtMem[pCut1->nLeaves], Abc_Lit2Var(pCut1->iCutFunc) );
    word * pTruth0  = (word *)p->puTemp[0];
    word * pTruth1  = (word *)p->puTemp[1];
    word * pTruth   = (word *)p->puTemp[2];
    Abc_TtCopy( pTruth0, pTruth0s, p->nTruth6Words[pCut0->nLeaves], fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iCutFunc) );
    Abc_TtCopy( pTruth1, pTruth1s, p->nTruth6Words[pCut1->nLeaves], fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iCutFunc) );
    Abc_TtStretch6( pTruth0, pCut0->nLeaves, pCut->nLeaves );
    Abc_TtStretch6( pTruth1, pCut1->nLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth0, pCut->nLeaves, pCut0->pLeaves, pCut0->nLeaves, pCut->pLeaves, pCut->nLeaves );
    Abc_TtExpand( pTruth1, pCut->nLeaves, pCut1->pLeaves, pCut1->nLeaves, pCut->pLeaves, pCut->nLeaves );
    fCompl         = (pTruth0[0] & pTruth1[0] & 1);
    Abc_TtAnd( pTruth, pTruth0, pTruth1, p->nTruth6Words[pCut->nLeaves], fCompl );
    if ( p->pPars->fCutMin && (pCut0->nLeaves + pCut1->nLeaves > pCut->nLeaves || pCut0->nLeaves == 0 || pCut1->nLeaves == 0) )
    {
        nLeavesNew = Abc_TtMinBase( pTruth, pCut->pLeaves, pCut->nLeaves, pCut->nLeaves );
        if ( nLeavesNew < If_CutLeaveNum(pCut) )
        {
            pCut->nLeaves = nLeavesNew;
            pCut->uSign   = If_ObjCutSignCompute( pCut );
            RetValue      = 1;
        }
    }
    PrevSize       = Vec_MemEntryNum( p->vTtMem[pCut->nLeaves] );   
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], pTruth );
    pCut->iCutFunc = Abc_Var2Lit( truthId, fCompl );
    assert( (pTruth[0] & 1) == 0 );
#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        char pCanonPerm[16];
        memcpy( pCopy, If_CutTruthW(pCut), sizeof(word) * p->nTruth6Words[pCut->nLeaves] );
        Abc_TtCanonicize( pCopy, pCut->nLeaves, pCanonPerm );
    }
#endif
    if ( p->vTtIsops[pCut->nLeaves] && PrevSize != Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) )
    {
        Vec_Int_t * vLevel = Vec_WecPushLevel( p->vTtIsops[pCut->nLeaves] );
        fCompl = Kit_TruthIsop( (unsigned *)pTruth, pCut->nLeaves, p->vCover, 1 );
        if ( fCompl >= 0 )
        {
            Vec_IntGrow( vLevel, Vec_IntSize(p->vCover) );
            Vec_IntAppend( vLevel, p->vCover );
            if ( fCompl )
                vLevel->nCap ^= (1<<16); // hack to remember complemented attribute
        }
        assert( Vec_WecSize(p->vTtIsops[pCut->nLeaves]) == Vec_MemEntryNum(p->vTtMem[pCut->nLeaves]) );
    }
    return RetValue;
}